

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ReadStream<long_double>
               (bool zero_padding,int stream_skip,int read_point,int read_size,
               vector<long_double,_std::allocator<long_double>_> *sequence_to_read,
               istream *input_stream,int *actual_read_size)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  iterator iVar6;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> __first;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_DIL;
  vector<long_double,_std::allocator<long_double>_> *in_R8;
  vector<long_double,_std::allocator<long_double>_> *in_R9;
  double dVar7;
  int *in_stack_00000008;
  int num_zeros;
  int gcount;
  int num_read_bytes;
  int end;
  int type_byte;
  difference_type in_stack_ffffffffffffff90;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  *in_stack_ffffffffffffff98;
  longdouble *in_stack_ffffffffffffffa8;
  vector<long_double,_std::allocator<long_double>_> *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (((((in_ESI < 0) || (in_EDX < 0)) || (in_ECX < 1)) ||
      ((in_R8 == (vector<long_double,_std::allocator<long_double>_> *)0x0 ||
       (in_R9 == (vector<long_double,_std::allocator<long_double>_> *)0x0)))) ||
     (uVar3 = std::ios::eof(), (uVar3 & 1) != 0)) {
    local_1 = false;
  }
  else {
    if (0 < in_ESI) {
      std::istream::ignore((long)in_R9);
      uVar3 = std::ios::eof();
      if ((uVar3 & 1) != 0) {
        return false;
      }
    }
    sVar4 = std::vector<long_double,_std::allocator<long_double>_>::size(in_R8);
    if (sVar4 < (ulong)(long)(in_EDX + in_ECX)) {
      std::vector<long_double,_std::allocator<long_double>_>::resize
                (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    }
    pvVar5 = std::vector<long_double,_std::allocator<long_double>_>::operator[](in_R8,0);
    std::istream::read((char *)in_R9,(long)(pvVar5 + in_EDX));
    iVar2 = std::istream::gcount();
    if (in_stack_00000008 != (int *)0x0) {
      *in_stack_00000008 = iVar2 / 0x10;
    }
    if (in_ECX * 0x10 == iVar2) {
      bVar1 = std::ios::fail();
      local_1 = (bool)((bVar1 ^ 0xff) & 1);
    }
    else if (((in_DIL & 1) == 0) || (iVar2 < 1)) {
      local_1 = false;
    }
    else {
      dVar7 = ceil((double)(in_ECX * 0x10 - iVar2) / 16.0);
      if ((int)dVar7 < 0) {
        local_1 = false;
      }
      else {
        iVar6 = std::vector<long_double,_std::allocator<long_double>_>::begin(in_R9);
        iVar2 = (int)((ulong)iVar6._M_current >> 0x20);
        __first = __gnu_cxx::
                  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                  ::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        __gnu_cxx::
        __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>::
        operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        std::
        fill_n<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,int,long_double>
                  (__first,iVar2,in_stack_ffffffffffffffa8);
        bVar1 = std::ios::bad();
        local_1 = (bool)((bVar1 ^ 0xff) & 1);
      }
    }
  }
  return local_1;
}

Assistant:

bool ReadStream(bool zero_padding, int stream_skip, int read_point,
                int read_size, std::vector<T>* sequence_to_read,
                std::istream* input_stream, int* actual_read_size) {
  if (stream_skip < 0 || read_point < 0 || read_size <= 0 ||
      NULL == sequence_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*sequence_to_read)[0]));

  if (0 < stream_skip) {
    input_stream->ignore(type_byte * stream_skip);
    if (input_stream->eof()) return false;
  }

  const int end(read_point + read_size);
  if (sequence_to_read->size() < static_cast<std::size_t>(end)) {
    sequence_to_read->resize(end);
  }

  const int num_read_bytes(type_byte * read_size);
  input_stream->read(
      reinterpret_cast<char*>(&((*sequence_to_read)[0]) + read_point),
      num_read_bytes);

  const int gcount(static_cast<int>(input_stream->gcount()));
  if (NULL != actual_read_size) {
    *actual_read_size = gcount / type_byte;
  }

  if (num_read_bytes == gcount) {
    return !input_stream->fail();
  } else if (zero_padding && 0 < gcount) {
    // Use std::ceil to zero incomplete data
    // as gcount may not be a multiple of sizeof(double).
    const int num_zeros(static_cast<int>(
        std::ceil(static_cast<double>(num_read_bytes - gcount) / type_byte)));
    if (num_zeros < 0) {
      return false;  // Something wrong!
    }

    std::fill_n(sequence_to_read->begin() + end - num_zeros, num_zeros,
                static_cast<T>(0));

    return !input_stream->bad();
  }

  return false;
}